

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  Lookaside *pLVar1;
  sqlite3 *db;
  Column *pCVar2;
  char *z;
  undefined1 uVar3;
  u16 uVar4;
  int iVar5;
  uint uVar6;
  FKey *p;
  sColMap *psVar7;
  Expr *pEVar8;
  Expr *pEVar9;
  Expr *pRight;
  SrcList *pSrc;
  char *pcVar10;
  ExprList *pEList;
  Trigger *p_00;
  Schema *pSVar11;
  Select *pSVar12;
  i16 *piVar13;
  long lVar14;
  u8 uVar15;
  long lVar16;
  bool bVar17;
  Select *local_118;
  TriggerStep *local_100;
  Expr *local_f8;
  Expr *local_e8;
  ExprList *local_c8;
  int *aiCol;
  int local_ac;
  int *local_a8;
  FKey *local_a0;
  Index *pIdx;
  Parse *local_90;
  i16 *local_88;
  sColMap *local_80;
  Token tFromCol;
  Token tNew;
  Token tOld;
  Token local_40;
  
  if ((pParse->db->flags & 0x4000) != 0) {
    local_ac = regOld;
    local_a8 = aChange;
    p = sqlite3FkReferences(pTab);
    bVar17 = pChanges != (ExprList *)0x0;
    local_88 = &pTab->iPKey;
    local_90 = pParse;
    for (; p != (FKey *)0x0; p = p->pNextTo) {
      if ((local_a8 == (int *)0x0) ||
         (iVar5 = fkParentIsModified(pTab,p,local_a8,bChngRowid), iVar5 != 0)) {
        db = pParse->db;
        uVar15 = p->aAction[bVar17];
        if ((db->flags >> 0x23 & 1) != 0) {
          uVar15 = '\0';
        }
        if ((((uint)db->flags >> 0x13 & 1) == 0) || (uVar15 != '\a')) {
          p_00 = p->apTrigger[bVar17];
          if ((uVar15 == '\0') || (p_00 != (Trigger *)0x0)) {
            if (p_00 != (Trigger *)0x0) {
LAB_00185b52:
              sqlite3CodeRowTriggerDirect(pParse,p_00,pTab,local_ac,2,0);
            }
          }
          else {
            pIdx = (Index *)0x0;
            aiCol = (int *)0x0;
            iVar5 = sqlite3FkLocateIndex(pParse,pTab,p,&pIdx,&aiCol);
            if (iVar5 == 0) {
              local_80 = p->aCol;
              lVar16 = 0;
              local_100 = (TriggerStep *)0x0;
              local_e8 = (Expr *)0x0;
              local_c8 = (ExprList *)0x0;
              local_f8 = (Expr *)0x0;
              local_a0 = p;
              for (lVar14 = 0; lVar14 < p->nCol; lVar14 = lVar14 + 1) {
                tOld.z = "old";
                tOld.n = 3;
                tOld._12_4_ = 0;
                psVar7 = (sColMap *)((long)aiCol + lVar16);
                if (aiCol == (int *)0x0) {
                  psVar7 = local_80;
                }
                tNew.z = "new";
                tNew.n = 3;
                tNew._12_4_ = 0;
                piVar13 = local_88;
                if (pIdx != (Index *)0x0) {
                  piVar13 = (i16 *)((long)pIdx->aiColumn + (long)local_100);
                }
                iVar5 = psVar7->iFrom;
                local_40.z = pTab->aCol[*piVar13].zCnName;
                local_40.n = sqlite3Strlen30(local_40.z);
                tFromCol.z = p->pFrom->aCol[iVar5].zCnName;
                tFromCol.n = sqlite3Strlen30(tFromCol.z);
                pEVar8 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                pEVar9 = sqlite3ExprAlloc(db,0x3b,&local_40,0);
                pParse = local_90;
                pEVar8 = sqlite3PExpr(local_90,0x8d,pEVar8,pEVar9);
                pEVar9 = sqlite3ExprAlloc(db,0x3b,&tFromCol,0);
                pEVar8 = sqlite3PExpr(pParse,0x35,pEVar8,pEVar9);
                local_e8 = sqlite3ExprAnd(pParse,local_e8,pEVar8);
                if (pChanges != (ExprList *)0x0) {
                  pEVar8 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                  pEVar9 = sqlite3ExprAlloc(db,0x3b,&local_40,0);
                  pEVar8 = sqlite3PExpr(pParse,0x8d,pEVar8,pEVar9);
                  pEVar9 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                  pRight = sqlite3ExprAlloc(db,0x3b,&local_40,0);
                  pEVar9 = sqlite3PExpr(pParse,0x8d,pEVar9,pRight);
                  pEVar8 = sqlite3PExpr(pParse,0x2d,pEVar8,pEVar9);
                  local_f8 = sqlite3ExprAnd(pParse,local_f8,pEVar8);
                }
                p = local_a0;
                if ((uVar15 != '\n' || pChanges != (ExprList *)0x0) && uVar15 != '\a') {
                  if (uVar15 == '\t') {
                    pCVar2 = local_a0->pFrom->aCol;
                    if (((pCVar2[iVar5].colFlags & 0x60) != 0) ||
                       (pEVar8 = sqlite3ColumnExpr(local_a0->pFrom,pCVar2 + iVar5),
                       pEVar8 == (Expr *)0x0)) goto LAB_0018584b;
                    pEVar8 = sqlite3ExprDup(db,pEVar8,0);
                  }
                  else if (uVar15 == '\n') {
                    pEVar8 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                    pEVar9 = sqlite3ExprAlloc(db,0x3b,&local_40,0);
                    pEVar8 = sqlite3PExpr(pParse,0x8d,pEVar8,pEVar9);
                  }
                  else {
LAB_0018584b:
                    pEVar8 = sqlite3ExprAlloc(db,0x79,(Token *)0x0,0);
                  }
                  local_c8 = sqlite3ExprListAppend(pParse,local_c8,pEVar8);
                  sqlite3ExprListSetName(pParse,local_c8,&tFromCol,0);
                }
                local_100 = (TriggerStep *)((long)local_100 + 2);
                lVar16 = lVar16 + 4;
              }
              sqlite3DbFree(db,aiCol);
              z = p->pFrom->zName;
              uVar6 = sqlite3Strlen30(z);
              if (uVar15 == '\a') {
                iVar5 = sqlite3SchemaToIndex(db,pTab->pSchema);
                pEVar8 = sqlite3Expr(db,0x47,"FOREIGN KEY constraint failed");
                if (pEVar8 != (Expr *)0x0) {
                  pEVar8->affExpr = '\x02';
                }
                pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
                if (pSrc != (SrcList *)0x0) {
                  pcVar10 = sqlite3DbStrDup(db,z);
                  pSrc->a[0].zName = pcVar10;
                  pcVar10 = sqlite3DbStrDup(db,db->aDb[iVar5].zDbSName);
                  pSrc->a[0].zDatabase = pcVar10;
                }
                pEList = sqlite3ExprListAppendNew(pParse->db,pEVar8);
                local_118 = sqlite3SelectNew(pParse,pEList,pSrc,local_e8,(ExprList *)0x0,(Expr *)0x0
                                             ,(ExprList *)0x0,0,(Expr *)0x0);
                local_e8 = (Expr *)0x0;
              }
              else {
                local_118 = (Select *)0x0;
              }
              (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
              (db->lookaside).sz = 0;
              p_00 = (Trigger *)sqlite3DbMallocZero(db,(ulong)uVar6 + 0xa9);
              if (p_00 == (Trigger *)0x0) {
                local_100 = (TriggerStep *)0x0;
              }
              else {
                local_100 = (TriggerStep *)(p_00 + 1);
                p_00->step_list = local_100;
                p_00[1].pWhen = (Expr *)&p_00[2].pWhen;
                memcpy(&p_00[2].pWhen,z,(ulong)uVar6);
                pSVar11 = (Schema *)sqlite3ExprDup(db,local_e8,1);
                p_00[1].pSchema = pSVar11;
                pSVar11 = (Schema *)sqlite3ExprListDup(db,local_c8,1);
                p_00[1].pTabSchema = pSVar11;
                pSVar12 = sqlite3SelectDup(db,local_118,1);
                *(Select **)&p_00[1].op = pSVar12;
                if (local_f8 == (Expr *)0x0) {
                  local_f8 = (Expr *)0x0;
                }
                else {
                  local_f8 = sqlite3PExpr(pParse,0x13,local_f8,(Expr *)0x0);
                  pEVar8 = sqlite3ExprDup(db,local_f8,1);
                  p_00->pWhen = pEVar8;
                }
              }
              pLVar1 = &db->lookaside;
              pLVar1->bDisable = pLVar1->bDisable - 1;
              if (pLVar1->bDisable == 0) {
                uVar4 = (db->lookaside).szTrue;
              }
              else {
                uVar4 = 0;
              }
              (db->lookaside).sz = uVar4;
              sqlite3ExprDelete(db,local_e8);
              sqlite3ExprDelete(db,local_f8);
              sqlite3ExprListDelete(db,local_c8);
              sqlite3SelectDelete(db,local_118);
              if (db->mallocFailed != '\x01') {
                if (uVar15 == '\a') {
                  uVar3 = 0x8a;
                }
                else if ((uVar15 == '\n') && (pChanges == (ExprList *)0x0)) {
                  uVar3 = 0x80;
                }
                else {
                  uVar3 = 0x81;
                }
                local_100->op = uVar3;
                local_100->pTrig = p_00;
                pSVar11 = pTab->pSchema;
                p_00->pSchema = pSVar11;
                p_00->pTabSchema = pSVar11;
                p->apTrigger[bVar17] = p_00;
                p_00->op = bVar17 | 0x80;
                goto LAB_00185b52;
              }
              fkTriggerDelete(db,p_00);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that
  ** refer to table pTab. If there is an action associated with the FK
  ** for this operation (either update or delete), invoke the associated
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}